

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall GameLoop::distributeArmies(GameLoop *this)

{
  vector<Player_*,_std::allocator<Player_*>_> *this_00;
  pointer ppCVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  int iVar2;
  bool bVar3;
  result_type_conflict rVar4;
  int iVar5;
  Country **country;
  reference ppPVar6;
  ostream *poVar7;
  pointer ppCVar8;
  reference ppCVar9;
  int iVar10;
  int iVar11;
  value_type pPVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int local_276c;
  uniform_int_distribution<int> distr;
  int countryToPlaceOn;
  mt19937 eng;
  
  this_00 = this->allPlayers;
  iVar2 = (int)((ulong)((long)(this_00->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar11 = iVar2 * -5 + 0x32;
  if (4 < iVar2 - 2U) {
    iVar11 = 0;
  }
  ppPVar6 = std::vector<Player_*,_std::allocator<Player_*>_>::at(this_00,0);
  pPVar12 = *ppPVar6;
  poVar7 = std::operator<<((ostream *)&std::cout,"\nEach player has ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
  std::operator<<(poVar7," armies to place on their countries. \n");
  iVar5 = 0;
  iVar10 = 0;
  if (0 < iVar2) {
    iVar10 = iVar2;
  }
  local_276c = 0;
  for (; iVar5 != iVar10; iVar5 = iVar5 + 1) {
    ppCVar1 = (pPVar12->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar8 = (pPVar12->pOwnedCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppCVar8 != ppCVar1; ppCVar8 = ppCVar8 + 1) {
      *(*ppCVar8)->pNumberOfTroops = 1;
    }
    PlayerStrategy::getStrategyName_abi_cxx11_((string *)&countryToPlaceOn,pPVar12->strategy);
    bVar3 = std::operator==((string *)&countryToPlaceOn,"HUMAN");
    std::__cxx11::string::~string((string *)&countryToPlaceOn);
    if (bVar3) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Placing 1 army per country.");
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,"Player ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pPVar12->pPlayerId);
      std::operator<<(poVar7," , please place your armies. Here is your list of countries :\n");
      for (uVar13 = 1;
          uVar15 = (long)(pPVar12->pOwnedCountries->
                         super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pPVar12->pOwnedCountries->
                         super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3, uVar13 <= uVar15;
          uVar13 = uVar13 + 1) {
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar7 = std::operator<<(poVar7," - ");
        ppCVar9 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (pPVar12->pOwnedCountries,uVar13 - 1);
        Map::Country::getCountryName_abi_cxx11_((string *)&countryToPlaceOn,*ppCVar9);
        poVar7 = std::operator<<(poVar7,(string *)&countryToPlaceOn);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string((string *)&countryToPlaceOn);
      }
      while( true ) {
        uVar14 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar14;
        if (iVar11 < (int)uVar14) break;
        do {
          do {
            poVar7 = std::operator<<((ostream *)&std::cout,"\nWhere do you place army number ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar14);
            std::operator<<(poVar7,": ");
            std::istream::operator>>((istream *)&std::cin,&countryToPlaceOn);
            std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13d520);
            std::istream::ignore((long)&std::cin,0x200);
          } while (countryToPlaceOn < 1);
          this_01 = pPVar12->pOwnedCountries;
        } while ((int)((ulong)((long)(this_01->
                                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_01->
                                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3) <
                 countryToPlaceOn);
        ppCVar9 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (this_01,(ulong)(countryToPlaceOn - 1));
        *(*ppCVar9)->pNumberOfTroops = *(*ppCVar9)->pNumberOfTroops + 1;
      }
    }
    else {
      std::random_device::random_device((random_device *)&countryToPlaceOn);
      uVar14 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&eng,(ulong)uVar14);
      uVar13 = (ulong)((long)(pPVar12->pOwnedCountries->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar12->pOwnedCountries->
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3;
      distr._M_param._M_a = 1;
      distr._M_param._M_b = (int)uVar13;
      while (uVar14 = (int)uVar13 + 1, uVar13 = (ulong)uVar14, (int)uVar14 <= iVar11) {
        rVar4 = std::uniform_int_distribution<int>::operator()(&distr,&eng);
        ppCVar9 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (pPVar12->pOwnedCountries,(long)(rVar4 + -1));
        *(*ppCVar9)->pNumberOfTroops = *(*ppCVar9)->pNumberOfTroops + 1;
      }
      std::random_device::~random_device((random_device *)&countryToPlaceOn);
    }
    local_276c = (local_276c + 1) % iVar2;
    ppPVar6 = std::vector<Player_*,_std::allocator<Player_*>_>::at
                        (this->allPlayers,(long)local_276c);
    pPVar12 = *ppPVar6;
  }
  return;
}

Assistant:

void GameLoop::distributeArmies() {
    int numberOfPlayers = allPlayers->size();
    int numberOfArmies = getNumberOfArmies(numberOfPlayers);
    int currentPlayerPosition = 0;
    Player* currentPlayer = allPlayers->at(currentPlayerPosition);
    int counter = 0;
    cout << "\nEach player has " << numberOfArmies << " armies to place on their countries. \n";
    while (counter < numberOfPlayers) {
        //place one troop per country
        for (auto& country : *currentPlayer->getOwnedCountries()) {
            country->setNumberOfTroops(1);
        }

        if (currentPlayer->getStrategy()->getStrategyName() == "HUMAN") {
            cout << "Placing 1 army per country." << std::endl;
            cout << "Player " << currentPlayer->getPlayerId()
                 << " , please place your armies. Here is your list of countries :\n";
            for (unsigned long i = 1; i <= currentPlayer->getOwnedCountries()->size(); i++) {
                cout << i << " - " << currentPlayer->getOwnedCountries()->at(i - 1)->getCountryName() << "\n";
            }
            for (int i = int(currentPlayer->getOwnedCountries()->size() + 1); i <= numberOfArmies; i++) {
                int countryToPlaceOn;
                do {
                    cout << "\nWhere do you place army number " << i << ": ";
                    cin >> countryToPlaceOn;
                    cin.clear();
                    cin.ignore(512, '\n');
                } while (countryToPlaceOn < 1 || countryToPlaceOn > int(currentPlayer->getOwnedCountries()->size()) ||
                         isnan(countryToPlaceOn));
                Map::Country* currCountry = currentPlayer->getOwnedCountries()->at(countryToPlaceOn - 1);
                currCountry->setNumberOfTroops(currCountry->getNumberOfTroops() + 1);
            }
        } else {
            std::random_device rd;
            std::mt19937 eng(rd());
            std::uniform_int_distribution<> distr(1, int(currentPlayer->getOwnedCountries()->size()));
            //place troops randomly
            for (int i = int(currentPlayer->getOwnedCountries()->size() + 1); i <= numberOfArmies; i++) {
                int countryToPlaceOn = distr(eng);
                Map::Country* currCountry = currentPlayer->getOwnedCountries()->at(countryToPlaceOn - 1);
                currCountry->setNumberOfTroops(currCountry->getNumberOfTroops() + 1);
            }
        }
        currentPlayerPosition++;
        currentPlayerPosition = currentPlayerPosition % numberOfPlayers;
        currentPlayer = allPlayers->at(currentPlayerPosition);
        counter++;
    }
}